

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O2

QVersionNumber __thiscall
QVersionNumber::commonPrefix(QVersionNumber *this,QVersionNumber *v1,QVersionNumber *v2)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  qsizetype qVar4;
  long len;
  long lVar5;
  
  bVar1 = (v1->m_segments).field_0.inline_segments[0];
  if ((bVar1 & 1) == 0) {
    lVar5 = (((v1->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    lVar5 = (long)((char)bVar1 >> 1);
  }
  bVar1 = (v2->m_segments).field_0.inline_segments[0];
  if ((bVar1 & 1) == 0) {
    qVar4 = (((v2->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    qVar4 = (qsizetype)((char)bVar1 >> 1);
  }
  if (lVar5 < qVar4) {
    qVar4 = lVar5;
  }
  lVar5 = 0;
  if (qVar4 < 1) {
    qVar4 = lVar5;
  }
  for (; len = qVar4, qVar4 != lVar5; lVar5 = lVar5 + 1) {
    iVar2 = segmentAt(v1,lVar5);
    iVar3 = segmentAt(v2,lVar5);
    len = lVar5;
    if (iVar2 != iVar3) break;
  }
  if (len == 0) {
    (this->m_segments).field_0.dummy = 1;
  }
  else {
    (this->m_segments).field_0.pointer_segments = (QList<int> *)&DAT_aaaaaaaaaaaaaaaa;
    if (((v1->m_segments).field_0.inline_segments[0] & 1U) != 0) {
      v2 = v1;
    }
    SegmentStorage::SegmentStorage(&this->m_segments,&v2->m_segments);
    SegmentStorage::resize(&this->m_segments,len);
  }
  return (QVersionNumber)(SegmentStorage)this;
}

Assistant:

QVersionNumber QVersionNumber::commonPrefix(const QVersionNumber &v1,
                                            const QVersionNumber &v2)
{
    qsizetype commonlen = qMin(v1.segmentCount(), v2.segmentCount());
    qsizetype i;
    for (i = 0; i < commonlen; ++i) {
        if (v1.segmentAt(i) != v2.segmentAt(i))
            break;
    }

    if (i == 0)
        return QVersionNumber();

    // try to use the one with inline segments, if there's one
    QVersionNumber result(!v1.m_segments.isUsingPointer() ? v1 : v2);
    result.m_segments.resize(i);
    return result;
}